

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImDrawList *draw_list;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window_00;
  long lVar4;
  long lVar5;
  
  pIVar2 = *(GImGui->Viewports).Data;
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  draw_list = window->DrawList;
  if (1 < (draw_list->_Splitter)._Count) {
    ImDrawListSplitter::Merge(&draw_list->_Splitter,draw_list);
  }
  ImGui::AddDrawListToDrawDataEx
            (&pIVar2->DrawDataP,(pIVar2->DrawDataBuilder).Layers[(uint)layer],window->DrawList);
  lVar5 = (long)(window->DC).ChildWindows.Size;
  if (lVar5 != 0) {
    ppIVar3 = (window->DC).ChildWindows.Data;
    lVar4 = 0;
    do {
      window_00 = *(ImGuiWindow **)((long)ppIVar3 + lVar4);
      if ((window_00->Active == true) && (window_00->Hidden == false)) {
        AddWindowToDrawData(window_00,layer);
      }
      lVar4 = lVar4 + 8;
    } while (lVar5 * 8 != lVar4);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    if (window->DrawList->_Splitter._Count > 1)
        window->DrawList->ChannelsMerge(); // Merge if user forgot to merge back. Also required in Docking branch for ImGuiWindowFlags_DockNodeHost windows.
    ImGui::AddDrawListToDrawDataEx(&viewport->DrawDataP, viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (ImGuiWindow* child : window->DC.ChildWindows)
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
}